

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O0

void mpp_sthd_grp_stop_sync(MppSThdGrp grp)

{
  MppSThdGrp pvVar1;
  char *pcVar2;
  MppSThdImpl *thd;
  RK_S32 i;
  void *dummy;
  MppSThdGrp pvStack_18;
  MppSThdStatus status;
  MppSThdGrpImpl *impl;
  MppSThdGrp grp_local;
  
  pvStack_18 = grp;
  impl = (MppSThdGrpImpl *)grp;
  if ((grp == (MppSThdGrp)0x0) &&
     (_mpp_log_l(2,"mpp_thread","Assertion %s failed at %s:%d\n",(char *)0x0,"impl",
                 "mpp_sthd_grp_stop_sync",0x27d), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  pthread_mutex_lock((pthread_mutex_t *)((long)pvStack_18 + 0x18));
  pvVar1 = pvStack_18;
  dummy._4_4_ = *(MppSThdStatus *)((long)pvStack_18 + 0x14);
  if (dummy._4_4_ == MPP_STHD_STOPPING) {
    dummy._4_4_ = MPP_STHD_STOPPING;
    for (thd._4_4_ = 0; pvVar1 = pvStack_18, thd._4_4_ < *(int *)((long)pvStack_18 + 0x10);
        thd._4_4_ = thd._4_4_ + 1) {
      pthread_join(*(pthread_t *)((long)pvStack_18 + (long)thd._4_4_ * 0x88 + 0x58),
                   (void **)&stack0xffffffffffffffd8);
      *(undefined4 *)((long)pvVar1 + (long)thd._4_4_ * 0x88 + 0x50) = 1;
    }
    *(undefined4 *)((long)pvStack_18 + 0x14) = 1;
  }
  else {
    pcVar2 = state2str(dummy._4_4_);
    _mpp_log_l(2,"mpp_thread","%s can NOT stop sync on %s\n",(char *)0x0,pvVar1,pcVar2);
  }
  pthread_mutex_unlock((pthread_mutex_t *)((long)pvStack_18 + 0x18));
  return;
}

Assistant:

void mpp_sthd_grp_stop_sync(MppSThdGrp grp)
{
    MppSThdGrpImpl *impl = (MppSThdGrpImpl *)grp;
    MppSThdStatus status;

    mpp_assert(impl);

    /* we can only change callback function on uninit */
    pthread_mutex_lock(&impl->lock);
    status = impl->status;
    switch (status) {
    case MPP_STHD_STOPPING : {
        void *dummy;
        RK_S32 i;

        status = MPP_STHD_STOPPING;
        for (i = 0; i < impl->count; i++) {
            MppSThdImpl *thd = &impl->thds[i];

            pthread_join(thd->thd, &dummy);
            thd->status = MPP_STHD_READY;
        }
        impl->status = MPP_STHD_READY;
    } break;
    default : {
        mpp_err("%s can NOT stop sync on %s\n", impl->name, state2str(status));
    } break;
    }
    pthread_mutex_unlock(&impl->lock);
}